

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O0

int anon_unknown.dwarf_7315::RtMidi_getversion(lua_State *L)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  string local_30 [8];
  string str;
  lua_State *L_local;
  
  str.field_2._8_8_ = L;
  RtMidi::getVersion_abi_cxx11_();
  uVar1 = str.field_2._8_8_;
  uVar2 = std::__cxx11::string::c_str();
  uVar3 = std::__cxx11::string::size();
  lua_pushlstring(uVar1,uVar2,uVar3);
  std::__cxx11::string::~string(local_30);
  return 1;
}

Assistant:

int RtMidi_getversion(lua_State *L) {
	auto str = RtMidi::getVersion();
	lua_pushlstring(L, str.c_str(), str.size());
	return 1;
}